

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O2

int dfsfast_r(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  int *piVar1;
  MinRegMan_t *pMVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Flow_Data_t *pFVar7;
  Abc_Obj_t *pAVar8;
  ulong uVar9;
  void *pvVar10;
  ulong uVar11;
  ushort uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  
  if (pManMR->fSinkDistTerminate != 0) {
    return 0;
  }
  uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar3 == 8) goto LAB_004104d3;
  if (pManMR->fIsForward == 0) {
    pFVar7 = pManMR->pDataArray;
    uVar11 = (ulong)(uint)pObj->Id;
    uVar12 = *(ushort *)(pFVar7 + uVar11);
  }
  else {
    if (uVar3 == 3) {
LAB_004104d3:
      if (pPred != (Abc_Obj_t *)0x0) {
        return 1;
      }
      __assert_fail("pPred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretFlow.c"
                    ,0x147,"int dfsfast_r(Abc_Obj_t *, Abc_Obj_t *)");
    }
    pFVar7 = pManMR->pDataArray;
    uVar11 = (ulong)(uint)pObj->Id;
    uVar12 = (ushort)*(uint *)(pFVar7 + uVar11);
    if ((pManMR->constraintMask & *(uint *)(pFVar7 + uVar11) & 0x90) != 0) goto LAB_004104d3;
  }
  *(ushort *)(pFVar7 + uVar11) = uVar12 | 2;
  pFVar7 = pManMR->pDataArray;
  uVar3 = pObj->Id;
  if ((undefined1  [24])((undefined1  [24])pFVar7[uVar3] & (undefined1  [24])0x4) ==
      (undefined1  [24])0x0) {
    if ((((undefined1  [24])((undefined1  [24])pFVar7[uVar3] & (undefined1  [24])0x1) ==
          (undefined1  [24])0x0) &&
        (*(uint *)&pFVar7[uVar3].field_0x10 >> 0x10 ==
         (*(uint *)&pFVar7[uVar3].field_0x10 & 0xffff) + 1)) &&
       (iVar4 = dfsfast_e(pObj,pObj), iVar4 != 0)) {
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 4;
LAB_0041058b:
      FSETPRED(pObj,pPred);
LAB_00410596:
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xfffd;
      return 1;
    }
  }
  else {
    pAVar8 = pFVar7[uVar3].field_1.pred;
    if ((((pAVar8 != (Abc_Obj_t *)0x0) &&
         ((undefined1  [24])((undefined1  [24])pFVar7[(uint)pAVar8->Id] & (undefined1  [24])0x1) ==
          (undefined1  [24])0x0)) &&
        ((uint)*(ushort *)&pFVar7[uVar3].field_0x12 ==
         *(ushort *)&pFVar7[(uint)pAVar8->Id].field_0x10 + 1)) &&
       (iVar4 = dfsfast_e(pAVar8,pAVar8), iVar4 != 0)) goto LAB_0041058b;
  }
  if (pManMR->fIsForward != 0) {
    for (lVar16 = 0; lVar16 < (pObj->vFanins).nSize; lVar16 = lVar16 + 1) {
      pAVar8 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar16]];
      pFVar7 = pManMR->pDataArray;
      if ((((undefined1  [24])((undefined1  [24])pFVar7[(uint)pAVar8->Id] & (undefined1  [24])0x2)
            == (undefined1  [24])0x0) &&
          ((uint)*(ushort *)&pFVar7[(uint)pObj->Id].field_0x12 ==
           *(ushort *)&pFVar7[(uint)pAVar8->Id].field_0x12 + 1)) &&
         (((*(uint *)&pAVar8->field_0x14 & 0xf) != 8 &&
          (iVar4 = dfsfast_r(pAVar8,pPred), iVar4 != 0)))) goto LAB_00410596;
    }
    if (pManMR->maxDelay != 0) {
      iVar4 = 0;
      while( true ) {
        if (pManMR->vTimeEdges[(uint)pObj->Id].nSize <= iVar4) break;
        pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pManMR->vTimeEdges + (uint)pObj->Id,iVar4);
        pFVar7 = pManMR->pDataArray;
        if ((((undefined1  [24])((undefined1  [24])pFVar7[(uint)pAVar8->Id] & (undefined1  [24])0x2)
              == (undefined1  [24])0x0) &&
            ((uint)*(ushort *)&pFVar7[(uint)pObj->Id].field_0x12 ==
             *(ushort *)&pFVar7[(uint)pAVar8->Id].field_0x12 + 1)) &&
           (iVar5 = dfsfast_r(pAVar8,pPred), iVar5 != 0)) goto LAB_00410596;
        iVar4 = iVar4 + 1;
      }
    }
  }
  *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
       *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xfffd;
  pFVar7 = pManMR->pDataArray;
  uVar11 = (ulong)(uint)pObj->Id;
  uVar3 = *(uint *)&pFVar7[uVar11].field_0x10;
  if ((undefined1  [24])((undefined1  [24])pFVar7[uVar11] & (undefined1  [24])0x4) ==
      (undefined1  [24])0x0) {
    uVar6 = uVar3 & 0xffff;
    if (uVar6 == 0) {
      uVar15 = 30000;
      goto LAB_004106fb;
    }
  }
  else {
    uVar15 = 30000;
    if ((pFVar7[uVar11].field_1.pred == (Abc_Obj_t *)0x0) ||
       (uVar6 = (uint)*(ushort *)&pFVar7[(uint)(pFVar7[uVar11].field_1.pred)->Id].field_0x10,
       *(ushort *)&pFVar7[(uint)(pFVar7[uVar11].field_1.pred)->Id].field_0x10 == 0))
    goto LAB_004106fb;
  }
  uVar15 = 30000;
  if (uVar6 < 30000) {
    uVar15 = uVar6;
  }
LAB_004106fb:
  uVar6 = uVar3;
  if (pManMR->fIsForward != 0) {
    uVar14 = (pObj->vFanins).nSize;
    uVar13 = 0;
    uVar9 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar9 = uVar13;
    }
    for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
      pvVar10 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[uVar13]];
      if ((((*(uint *)((long)pvVar10 + 0x14) & 0xf) != 8) &&
          (0xffff < *(uint *)&pFVar7[*(uint *)((long)pvVar10 + 0x10)].field_0x10)) &&
         (uVar14 = *(uint *)&pFVar7[*(uint *)((long)pvVar10 + 0x10)].field_0x10 >> 0x10,
         uVar14 <= uVar15)) {
        uVar15 = uVar14;
      }
    }
    if (pManMR->maxDelay != 0) {
      for (iVar4 = 0; iVar4 < pManMR->vTimeEdges[uVar11].nSize; iVar4 = iVar4 + 1) {
        pvVar10 = Vec_PtrEntry(pManMR->vTimeEdges + uVar11,iVar4);
        pFVar7 = pManMR->pDataArray;
        uVar6 = *(uint *)&pFVar7[*(uint *)((long)pvVar10 + 0x10)].field_0x10 >> 0x10;
        if (uVar15 < uVar6) {
          uVar6 = uVar15;
        }
        if (0xffff < *(uint *)&pFVar7[*(uint *)((long)pvVar10 + 0x10)].field_0x10) {
          uVar15 = uVar6;
        }
        uVar11 = (ulong)(uint)pObj->Id;
      }
      uVar6 = (uint)*(ushort *)&pFVar7[uVar11].field_0x10;
    }
  }
  uVar14 = uVar15 + 1;
  if (0x752e < uVar15) {
    uVar14 = 0;
  }
  *(uint *)&pFVar7[uVar11].field_0x10 = uVar6 & 0xffff | uVar14 << 0x10;
  pMVar2 = pManMR;
  if (pManMR->vSinkDistHist->nSize <= (int)uVar14) {
    __assert_fail("min_dist < Vec_IntSize(pManMR->vSinkDistHist)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretFlow.c"
                  ,0x1fb,"void dfsfast_r_retreat(Abc_Obj_t *)");
  }
  piVar1 = pManMR->vSinkDistHist->pArray;
  piVar1[uVar3 >> 0x10] = piVar1[uVar3 >> 0x10] + -1;
  piVar1[uVar14] = piVar1[uVar14] + 1;
  if (piVar1[uVar3 >> 0x10] == 0) {
    pMVar2->fSinkDistTerminate = 1;
    return 0;
  }
  return 0;
}

Assistant:

int dfsfast_r( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext, *pOldPred;

  if (pManMR->fSinkDistTerminate) return 0;

#ifdef DEBUG_VISITED
  printf("(%dr=%d) ", Abc_ObjId(pObj), FDATA(pObj)->r_dist);
#endif  

  // have we reached the sink?
  if (Abc_ObjIsLatch(pObj) ||
      (pManMR->fIsForward && Abc_ObjIsPo(pObj)) || 
      (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
    assert(pPred);
    return 1;
  }

  FSET(pObj, VISITED_R);

  if (FTEST(pObj, FLOW)) {

    pOldPred = FGETPRED(pObj);
    if (pOldPred && 
        !FTEST(pOldPred, VISITED_E) &&
        FDIST(pObj, r, pOldPred, e) &&
        dfsfast_e(pOldPred, pOldPred)) {

      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("fr");
#endif
      goto found;
    }
    
  } else {

    if (!FTEST(pObj, VISITED_E) &&
        FDIST(pObj, r, pObj, e) &&
        dfsfast_e(pObj, pObj)) {

      FSET(pObj, FLOW);
      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("f");
#endif
      goto found;
    }
  }
 
  // 2. reverse edges (forward retiming only)
  if (pManMR->fIsForward) {
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          FDIST(pObj, r, pNext, r) &&
          !Abc_ObjIsLatch(pNext) &&
          dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }
  
  // 3. timing edges (forward retiming only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_R) &&
            FDIST(pObj, r, pNext, r) &&
            dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  FUNSET(pObj, VISITED_R);
  dfsfast_r_retreat(pObj);
  return 0;

 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif
  FUNSET(pObj, VISITED_R);
  return 1;
}